

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O1

void uavs3d_funs_init_mc_c(void)

{
  long lVar1;
  
  lVar1 = -6;
  do {
    uavs3d_funs_handle.ipflt[0][lVar1] = uavs3d_if_cpy;
    uavs3d_funs_handle.ipflt[1][lVar1] = uavs3d_if_hor_luma;
    uavs3d_funs_handle.ipflt[2][lVar1] = uavs3d_if_hor_chroma;
    (*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
      (uavs3d_funs_handle.ipflt_ext + -1))[lVar1] = uavs3d_if_ver_luma;
    uavs3d_funs_handle.ipflt_ext[0][lVar1] = uavs3d_if_ver_chroma;
    uavs3d_funs_handle.avg_pel[lVar1 + -6] = uavs3d_if_hor_ver_luma;
    uavs3d_funs_handle.avg_pel[lVar1] = uavs3d_if_hor_ver_chroma;
    uavs3d_funs_handle.recon_luma[lVar1 + -1] = uavs3d_avg_pel;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  return;
}

Assistant:

void uavs3d_funs_init_mc_c() {
    int i;
    for (i = 0; i < BLOCK_WIDTH_TYPES_NUM; i++) {
        uavs3d_funs_handle.ipcpy[i] = uavs3d_if_cpy;
        uavs3d_funs_handle.ipflt[IPFILTER_H_8][i] = uavs3d_if_hor_luma;
        uavs3d_funs_handle.ipflt[IPFILTER_H_4][i] = uavs3d_if_hor_chroma;
        uavs3d_funs_handle.ipflt[IPFILTER_V_8][i] = uavs3d_if_ver_luma;
        uavs3d_funs_handle.ipflt[IPFILTER_V_4][i] = uavs3d_if_ver_chroma;
        uavs3d_funs_handle.ipflt_ext[IPFILTER_EXT_8][i] = uavs3d_if_hor_ver_luma;
        uavs3d_funs_handle.ipflt_ext[IPFILTER_EXT_4][i] = uavs3d_if_hor_ver_chroma;
        uavs3d_funs_handle.avg_pel[i]   = uavs3d_avg_pel;
    }
}